

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_HTMLparser(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  size_t sVar25;
  htmlParserCtxtPtr pxVar26;
  char *pcVar27;
  htmlDocPtr pxVar28;
  xmlChar *pxVar29;
  undefined8 uVar30;
  ulong uVar31;
  int nr;
  int nr_00;
  int n_doc;
  uint uVar32;
  uint uVar33;
  char *pcVar34;
  int test_ret;
  int iVar35;
  ulong *puVar36;
  htmlDocPtr in_RSI;
  int iVar37;
  htmlDocPtr pxVar38;
  int test_ret_4;
  int *piVar39;
  undefined4 *puVar40;
  int test_ret_5;
  uint uVar41;
  undefined4 uVar42;
  int n_ctxt;
  uint uVar43;
  int test_ret_1;
  undefined4 *local_78;
  int test_ret_3;
  int local_5c;
  int local_58;
  int local_54;
  int test_ret_9;
  int local_48;
  int local_44;
  int test_ret_7;
  
  if (quiet == '\0') {
    puts("Testing HTMLparser : 32 of 38 functions ...");
  }
  bVar1 = true;
  iVar35 = 0;
  while (bVar1) {
    uVar31 = 0;
    while (iVar37 = (int)uVar31, iVar37 != 2) {
      pxVar38 = (htmlDocPtr)0x0;
      if (iVar37 == 0) {
        pxVar38 = (htmlDocPtr)(inttab + 1);
      }
      bVar1 = true;
      while (bVar1) {
        pxVar28 = (htmlDocPtr)0x0;
        while (iVar4 = (int)pxVar28, iVar4 != 2) {
          iVar2 = xmlMemBlocks();
          uVar30 = 0;
          if (iVar4 == 0) {
            uVar30 = 0x16aa1c;
          }
          in_RSI = pxVar38;
          UTF8ToHtml(0,pxVar38,0,uVar30);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar3 = xmlMemBlocks();
          if (iVar2 != iVar3) {
            iVar3 = xmlMemBlocks();
            printf("Leak of %d blocks found in UTF8ToHtml",(ulong)(uint)(iVar3 - iVar2));
            iVar35 = iVar35 + 1;
            printf(" %d",0);
            printf(" %d",uVar31);
            printf(" %d",0);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar28;
          }
          pxVar28 = (htmlDocPtr)(ulong)(iVar4 + 1);
        }
        bVar1 = false;
      }
      uVar31 = (ulong)(iVar37 + 1);
    }
    bVar1 = false;
  }
  function_tests = function_tests + 1;
  pxVar38 = (htmlDocPtr)0x1;
  local_54 = 0;
  while (pxVar38 != (htmlDocPtr)0x0) {
    uVar31 = 0;
    while( true ) {
      pxVar38 = (htmlDocPtr)0x0;
      iVar37 = (int)uVar31;
      if (iVar37 == 5) break;
      while( true ) {
        iVar4 = (int)in_RSI;
        iVar2 = (int)pxVar38;
        if (iVar2 == 4) break;
        iVar3 = xmlMemBlocks();
        in_RSI = (htmlDocPtr)gen_const_xmlChar_ptr(iVar37,iVar4);
        iVar4 = gen_int(iVar2,iVar4);
        htmlAttrAllowed(0,in_RSI,iVar4);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar3 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlAttrAllowed",(ulong)(uint)(iVar4 - iVar3));
          local_54 = local_54 + 1;
          printf(" %d",0);
          printf(" %d",uVar31);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar38;
        }
        pxVar38 = (htmlDocPtr)(ulong)(iVar2 + 1);
      }
      uVar31 = (ulong)(iVar37 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar37 = 0;
  uVar31 = 0;
  while (iVar4 = (int)uVar31, iVar4 != 3) {
    for (iVar2 = 0; iVar2 != 5; iVar2 = iVar2 + 1) {
      bVar1 = true;
      while (iVar3 = (int)in_RSI, bVar1) {
        iVar5 = xmlMemBlocks();
        pxVar38 = gen_htmlDocPtr(iVar4,iVar3);
        in_RSI = (htmlDocPtr)gen_const_xmlChar_ptr(iVar2,iVar3);
        htmlAutoCloseTag(pxVar38,in_RSI,0);
        call_tests = call_tests + 1;
        des_htmlDocPtr((int)pxVar38,in_RSI,nr);
        xmlResetLastError();
        iVar3 = xmlMemBlocks();
        if (iVar5 == iVar3) break;
        iVar3 = xmlMemBlocks();
        bVar1 = false;
        printf("Leak of %d blocks found in htmlAutoCloseTag",(ulong)(uint)(iVar3 - iVar5));
        iVar37 = iVar37 + 1;
        printf(" %d",uVar31);
        printf(" %d");
        in_RSI = (htmlDocPtr)0x0;
        printf(" %d");
        putchar(10);
      }
    }
    uVar31 = (ulong)(iVar4 + 1);
  }
  function_tests = function_tests + 1;
  local_48 = 0;
  for (iVar4 = 0; iVar4 != 4; iVar4 = iVar4 + 1) {
    pxVar38 = (htmlDocPtr)0x0;
    while (iVar2 = (int)pxVar38, iVar2 != 4) {
      iVar3 = xmlMemBlocks();
      if (iVar4 == 0) {
        bVar1 = false;
        pcVar34 = "foo";
      }
      else if (iVar4 == 2) {
        bVar1 = false;
        pcVar34 = "test/ent2";
      }
      else if (iVar4 == 1) {
        bVar1 = false;
        pcVar34 = "<foo/>";
      }
      else {
        bVar1 = true;
        pcVar34 = (char *)0x0;
      }
      uVar6 = gen_int(iVar2,(int)in_RSI);
      if ((bVar1) || (sVar25 = strlen(pcVar34), (int)uVar6 <= (int)sVar25 + 1)) {
        in_RSI = (htmlDocPtr)(ulong)uVar6;
        pxVar26 = (htmlParserCtxtPtr)htmlCreateMemoryParserCtxt(pcVar34);
        desret_htmlParserCtxtPtr(pxVar26);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar3 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlCreateMemoryParserCtxt",
                 (ulong)(uint)(iVar5 - iVar3));
          local_48 = local_48 + 1;
          printf(" %d",iVar4);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar38;
        }
      }
      pxVar38 = (htmlDocPtr)(ulong)(iVar2 + 1);
    }
  }
  function_tests = function_tests + 1;
  uVar6 = 1;
  iVar4 = 0;
  while (uVar6 != 0) {
    for (uVar41 = 0; uVar6 = 0, uVar41 != 3; uVar41 = uVar41 + 1) {
      for (; uVar6 != 4; uVar6 = uVar6 + 1) {
        for (uVar43 = 0; uVar43 != 4; uVar43 = uVar43 + 1) {
          for (iVar2 = 0; iVar2 != 6; iVar2 = iVar2 + 1) {
            local_78 = &DAT_001540b0;
            for (uVar32 = 0; uVar32 != 4; uVar32 = uVar32 + 1) {
              iVar3 = xmlMemBlocks();
              piVar39 = &call_tests;
              if (uVar41 != 0) {
                if (uVar41 == 1) {
                  piVar39 = (int *)0xffffffffffffffff;
                }
                else {
                  piVar39 = (int *)0x0;
                }
              }
              if (uVar6 == 0) {
                bVar1 = false;
                pcVar34 = "foo";
              }
              else if (uVar6 == 2) {
                bVar1 = false;
                pcVar34 = "test/ent2";
              }
              else if (uVar6 == 1) {
                bVar1 = false;
                pcVar34 = "<foo/>";
              }
              else {
                bVar1 = true;
                pcVar34 = (char *)0x0;
              }
              iVar5 = gen_int(uVar43,(int)in_RSI);
              pcVar27 = gen_fileoutput(iVar2,(int)in_RSI);
              uVar42 = 0xffffffff;
              if (uVar32 < 3) {
                uVar42 = *local_78;
              }
              if ((bVar1) || (sVar25 = strlen(pcVar34), iVar5 <= (int)sVar25 + 1)) {
                pxVar26 = (htmlParserCtxtPtr)
                          htmlCreatePushParserCtxt(0,piVar39,pcVar34,iVar5,pcVar27,uVar42);
                desret_htmlParserCtxtPtr(pxVar26);
                call_tests = call_tests + 1;
                xmlResetLastError();
                iVar5 = xmlMemBlocks();
                in_RSI = (htmlDocPtr)piVar39;
                if (iVar3 != iVar5) {
                  iVar5 = xmlMemBlocks();
                  printf("Leak of %d blocks found in htmlCreatePushParserCtxt",
                         (ulong)(uint)(iVar5 - iVar3));
                  iVar4 = iVar4 + 1;
                  printf(" %d",0);
                  printf(" %d",(ulong)uVar41);
                  printf(" %d",(ulong)uVar6);
                  printf(" %d",(ulong)uVar43);
                  printf(" %d",iVar2);
                  in_RSI = (htmlDocPtr)(ulong)uVar32;
                  printf(" %d");
                  putchar(10);
                }
              }
              local_78 = local_78 + 1;
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  local_44 = 0;
  for (uVar6 = 0; uVar6 != 3; uVar6 = uVar6 + 1) {
    for (iVar2 = 0; iVar2 != 5; iVar2 = iVar2 + 1) {
      for (iVar3 = 0; iVar3 != 8; iVar3 = iVar3 + 1) {
        uVar31 = 0;
        while (uVar41 = (uint)uVar31, uVar41 != 4) {
          pxVar38 = (htmlDocPtr)0x0;
          while( true ) {
            iVar8 = (int)in_RSI;
            iVar5 = (int)pxVar38;
            if (iVar5 == 4) break;
            iVar7 = xmlMemBlocks();
            pxVar26 = gen_htmlParserCtxtPtr(uVar6,iVar8);
            in_RSI = (htmlDocPtr)gen_const_xmlChar_ptr(iVar2,iVar8);
            pcVar34 = gen_filepath(iVar3,iVar8);
            if (uVar41 < 3) {
              uVar30 = (&DAT_00167d78)[uVar31];
            }
            else {
              uVar30 = 0;
            }
            iVar8 = gen_int(iVar5,iVar8);
            pxVar28 = (htmlDocPtr)htmlCtxtReadDoc(pxVar26,in_RSI,pcVar34,uVar30,iVar8);
            desret_htmlDocPtr(pxVar28);
            call_tests = call_tests + 1;
            if (pxVar26 != (htmlParserCtxtPtr)0x0) {
              htmlFreeParserCtxt();
            }
            xmlResetLastError();
            iVar8 = xmlMemBlocks();
            if (iVar7 != iVar8) {
              iVar8 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlCtxtReadDoc",(ulong)(uint)(iVar8 - iVar7));
              local_44 = local_44 + 1;
              printf(" %d",(ulong)uVar6);
              printf(" %d",iVar2);
              printf(" %d",iVar3);
              printf(" %d",uVar31);
              printf(" %d");
              putchar(10);
              in_RSI = pxVar38;
            }
            pxVar38 = (htmlDocPtr)(ulong)(iVar5 + 1);
          }
          uVar31 = (ulong)(uVar41 + 1);
        }
      }
    }
  }
  iVar35 = local_54 + iVar35 + iVar37 + local_48;
  function_tests = function_tests + 1;
  for (iVar37 = 0; iVar37 != 3; iVar37 = iVar37 + 1) {
    for (iVar2 = 0; iVar2 != 8; iVar2 = iVar2 + 1) {
      uVar31 = 0;
      while (uVar6 = (uint)uVar31, uVar6 != 4) {
        for (iVar3 = 0; iVar5 = (int)in_RSI, iVar3 != 4; iVar3 = iVar3 + 1) {
          pxVar26 = gen_htmlParserCtxtPtr(iVar37,iVar5);
          in_RSI = (htmlDocPtr)gen_filepath(iVar2,iVar5);
          if (uVar6 < 3) {
            uVar30 = (&DAT_00167d78)[uVar31];
          }
          else {
            uVar30 = 0;
          }
          iVar5 = gen_int(iVar3,iVar5);
          pxVar38 = (htmlDocPtr)htmlCtxtReadFile(pxVar26,in_RSI,uVar30,iVar5);
          desret_htmlDocPtr(pxVar38);
          call_tests = call_tests + 1;
          if (pxVar26 != (htmlParserCtxtPtr)0x0) {
            htmlFreeParserCtxt(pxVar26);
          }
          xmlResetLastError();
        }
        uVar31 = (ulong)(uVar6 + 1);
      }
    }
  }
  function_tests = function_tests + 1;
  local_48 = 0;
  for (iVar37 = 0; iVar37 != 3; iVar37 = iVar37 + 1) {
    for (uVar6 = 0; uVar6 != 4; uVar6 = uVar6 + 1) {
      for (uVar41 = 0; uVar41 != 4; uVar41 = uVar41 + 1) {
        for (uVar43 = 0; uVar43 != 8; uVar43 = uVar43 + 1) {
          for (uVar32 = 0; uVar32 != 4; uVar32 = uVar32 + 1) {
            for (uVar33 = 0; uVar33 != 4; uVar33 = uVar33 + 1) {
              iVar2 = xmlMemBlocks();
              pxVar26 = gen_htmlParserCtxtPtr(iVar37,(int)in_RSI);
              if (uVar6 == 0) {
                bVar1 = false;
                pcVar34 = "foo";
              }
              else if (uVar6 == 2) {
                bVar1 = false;
                pcVar34 = "test/ent2";
              }
              else if (uVar6 == 1) {
                bVar1 = false;
                pcVar34 = "<foo/>";
              }
              else {
                bVar1 = true;
                pcVar34 = (char *)0x0;
              }
              iVar3 = gen_int(uVar41,(int)in_RSI);
              pcVar27 = gen_filepath(uVar43,(int)in_RSI);
              if (uVar32 < 3) {
                uVar30 = (&DAT_00167d78)[uVar32];
              }
              else {
                uVar30 = 0;
              }
              iVar5 = gen_int(uVar33,(int)in_RSI);
              if ((bVar1) || (sVar25 = strlen(pcVar34), iVar3 <= (int)sVar25 + 1)) {
                pxVar38 = (htmlDocPtr)htmlCtxtReadMemory(pxVar26,pcVar34,iVar3,pcVar27,uVar30,iVar5)
                ;
                desret_htmlDocPtr(pxVar38);
                call_tests = call_tests + 1;
                in_RSI = (htmlDocPtr)pcVar34;
                if (pxVar26 != (htmlParserCtxtPtr)0x0) {
                  htmlFreeParserCtxt();
                  in_RSI = (htmlDocPtr)pcVar34;
                }
                xmlResetLastError();
                iVar3 = xmlMemBlocks();
                if (iVar2 != iVar3) {
                  iVar3 = xmlMemBlocks();
                  printf("Leak of %d blocks found in htmlCtxtReadMemory",
                         (ulong)(uint)(iVar3 - iVar2));
                  local_48 = local_48 + 1;
                  printf(" %d",iVar37);
                  printf(" %d",(ulong)uVar6);
                  printf(" %d",(ulong)uVar41);
                  printf(" %d",(ulong)uVar43);
                  printf(" %d",uVar32);
                  in_RSI = (htmlDocPtr)(ulong)uVar33;
                  printf(" %d");
                  putchar(10);
                }
              }
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  iVar37 = 0;
  for (uVar6 = 0; uVar6 != 3; uVar6 = uVar6 + 1) {
    iVar2 = xmlMemBlocks();
    pxVar26 = gen_htmlParserCtxtPtr(uVar6,(int)in_RSI);
    htmlCtxtReset();
    call_tests = call_tests + 1;
    if (pxVar26 != (htmlParserCtxtPtr)0x0) {
      htmlFreeParserCtxt();
    }
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlCtxtReset",(ulong)(uint)(iVar3 - iVar2));
      iVar37 = iVar37 + 1;
      in_RSI = (htmlDocPtr)(ulong)uVar6;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar31 = 0;
  while (iVar3 = (int)uVar31, iVar3 != 3) {
    pxVar38 = (htmlDocPtr)0x0;
    while( true ) {
      iVar5 = (int)in_RSI;
      iVar8 = (int)pxVar38;
      if (iVar8 == 4) break;
      iVar7 = xmlMemBlocks();
      pxVar26 = gen_htmlParserCtxtPtr(iVar3,iVar5);
      uVar6 = gen_int(iVar8,iVar5);
      in_RSI = (htmlDocPtr)(ulong)uVar6;
      htmlCtxtUseOptions();
      call_tests = call_tests + 1;
      if (pxVar26 != (htmlParserCtxtPtr)0x0) {
        htmlFreeParserCtxt();
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar7 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlCtxtUseOptions",(ulong)(uint)(iVar5 - iVar7));
        iVar2 = iVar2 + 1;
        printf(" %d",uVar31);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar38;
      }
      pxVar38 = (htmlDocPtr)(ulong)(iVar8 + 1);
    }
    uVar31 = (ulong)(iVar3 + 1);
  }
  iVar35 = iVar35 + iVar4 + local_44 + local_48;
  function_tests = function_tests + 1;
  bVar1 = true;
  iVar4 = 0;
  while (bVar1) {
    pxVar38 = (htmlDocPtr)0x0;
    while( true ) {
      iVar3 = (int)in_RSI;
      iVar5 = (int)pxVar38;
      if (iVar5 == 5) break;
      iVar8 = xmlMemBlocks();
      in_RSI = (htmlDocPtr)gen_const_xmlChar_ptr(iVar5,iVar3);
      htmlElementAllowedHere();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar8 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlElementAllowedHere",(ulong)(uint)(iVar3 - iVar8));
        iVar4 = iVar4 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar38;
      }
      pxVar38 = (htmlDocPtr)(ulong)(iVar5 + 1);
    }
    bVar1 = false;
  }
  function_tests = function_tests + 1;
  iVar3 = 0;
  bVar1 = true;
LAB_0011c0e1:
  if (bVar1) {
    bVar1 = true;
    while (bVar1) {
      iVar5 = xmlMemBlocks();
      bVar1 = false;
      in_RSI = (htmlDocPtr)0x0;
      htmlElementStatusHere(0);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar5 == iVar8) goto LAB_0011c0e1;
      xmlMemBlocks();
      bVar1 = false;
      printf("Leak of %d blocks found in htmlElementStatusHere");
      iVar3 = iVar3 + 1;
      printf(" %d");
      in_RSI = (htmlDocPtr)0x0;
      printf(" %d");
      putchar(10);
    }
    bVar1 = false;
    goto LAB_0011c0e1;
  }
  function_tests = function_tests + 1;
  bVar1 = true;
  iVar5 = 0;
  while (bVar1) {
    for (iVar8 = 0; iVar8 != 2; iVar8 = iVar8 + 1) {
      pxVar38 = (htmlDocPtr)0x0;
      if (iVar8 == 0) {
        pxVar38 = (htmlDocPtr)(inttab + 1);
      }
      pxVar28 = (htmlDocPtr)0x1;
      while (pxVar28 != (htmlDocPtr)0x0) {
        uVar31 = 0;
        while( true ) {
          pxVar28 = (htmlDocPtr)0x0;
          iVar7 = (int)uVar31;
          if (iVar7 == 2) break;
          uVar30 = 0;
          if (iVar7 == 0) {
            uVar30 = 0x16aa1c;
          }
          while( true ) {
            iVar10 = (int)in_RSI;
            iVar11 = (int)pxVar28;
            if (iVar11 == 4) break;
            iVar9 = xmlMemBlocks();
            iVar10 = gen_int(iVar11,iVar10);
            in_RSI = pxVar38;
            htmlEncodeEntities(0,pxVar38,0,uVar30,iVar10);
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar10 = xmlMemBlocks();
            if (iVar9 != iVar10) {
              iVar10 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlEncodeEntities",(ulong)(uint)(iVar10 - iVar9));
              iVar5 = iVar5 + 1;
              printf(" %d",0);
              printf(" %d",iVar8);
              printf(" %d",0);
              printf(" %d",uVar31);
              printf(" %d");
              putchar(10);
              in_RSI = pxVar28;
            }
            pxVar28 = (htmlDocPtr)(ulong)(iVar11 + 1);
          }
          uVar31 = (ulong)(iVar7 + 1);
        }
      }
    }
    bVar1 = false;
  }
  function_tests = function_tests + 1;
  iVar8 = 0;
  for (uVar6 = 0; uVar6 != 5; uVar6 = uVar6 + 1) {
    iVar7 = xmlMemBlocks();
    pxVar29 = gen_const_xmlChar_ptr(uVar6,(int)in_RSI);
    htmlEntityLookup(pxVar29);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar11 = xmlMemBlocks();
    if (iVar7 != iVar11) {
      iVar11 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlEntityLookup",(ulong)(uint)(iVar11 - iVar7));
      iVar8 = iVar8 + 1;
      in_RSI = (htmlDocPtr)(ulong)uVar6;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  puVar40 = &DAT_00154074;
  iVar7 = 0;
  for (uVar6 = 0; uVar6 != 3; uVar6 = uVar6 + 1) {
    iVar11 = xmlMemBlocks();
    htmlEntityValueLookup(*puVar40);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar11 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlEntityValueLookup",(ulong)(uint)(iVar10 - iVar11));
      iVar7 = iVar7 + 1;
      in_RSI = (htmlDocPtr)(ulong)uVar6;
      printf(" %d");
      putchar(10);
    }
    puVar40 = puVar40 + 1;
  }
  function_tests = function_tests + 1;
  iVar11 = 0;
  for (uVar6 = 0; uVar6 != 4; uVar6 = uVar6 + 1) {
    iVar10 = xmlMemBlocks();
    iVar9 = gen_int(uVar6,(int)in_RSI);
    htmlHandleOmittedElem(iVar9);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar10 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlHandleOmittedElem",(ulong)(uint)(iVar9 - iVar10));
      iVar11 = iVar11 + 1;
      in_RSI = (htmlDocPtr)(ulong)uVar6;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar9 = 0;
  for (iVar10 = 0; iVar10 != 3; iVar10 = iVar10 + 1) {
    bVar1 = true;
    while (iVar13 = (int)in_RSI, bVar1) {
      iVar12 = xmlMemBlocks();
      pxVar38 = gen_htmlDocPtr(iVar10,iVar13);
      in_RSI = (htmlDocPtr)0x0;
      htmlIsAutoClosed(pxVar38);
      call_tests = call_tests + 1;
      des_htmlDocPtr((int)pxVar38,in_RSI,nr_00);
      xmlResetLastError();
      iVar13 = xmlMemBlocks();
      if (iVar12 == iVar13) break;
      iVar13 = xmlMemBlocks();
      bVar1 = false;
      printf("Leak of %d blocks found in htmlIsAutoClosed",(ulong)(uint)(iVar13 - iVar12));
      iVar9 = iVar9 + 1;
      printf(" %d");
      in_RSI = (htmlDocPtr)0x0;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar10 = 0;
  for (uVar6 = 0; uVar6 != 5; uVar6 = uVar6 + 1) {
    iVar13 = xmlMemBlocks();
    pxVar29 = gen_const_xmlChar_ptr(uVar6,(int)in_RSI);
    htmlIsScriptAttribute(pxVar29);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar12 = xmlMemBlocks();
    if (iVar13 != iVar12) {
      iVar12 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlIsScriptAttribute",(ulong)(uint)(iVar12 - iVar13));
      iVar10 = iVar10 + 1;
      in_RSI = (htmlDocPtr)(ulong)uVar6;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar13 = xmlMemBlocks();
  pxVar26 = (htmlParserCtxtPtr)htmlNewParserCtxt();
  desret_htmlParserCtxtPtr(pxVar26);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar12 = xmlMemBlocks();
  if (iVar13 != iVar12) {
    iVar14 = xmlMemBlocks();
    in_RSI = (htmlDocPtr)(ulong)(uint)(iVar14 - iVar13);
    printf("Leak of %d blocks found in htmlNewParserCtxt");
    putchar(10);
  }
  function_tests = function_tests + 1;
  bVar1 = true;
  local_5c = 0;
  while (bVar1) {
    for (uVar6 = 0; iVar14 = (int)in_RSI, uVar6 != 4; uVar6 = uVar6 + 1) {
      iVar15 = xmlMemBlocks();
      uVar41 = gen_int(uVar6,iVar14);
      in_RSI = (htmlDocPtr)(ulong)uVar41;
      htmlNodeStatus();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar14 = xmlMemBlocks();
      if (iVar15 != iVar14) {
        iVar14 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlNodeStatus",(ulong)(uint)(iVar14 - iVar15));
        local_5c = local_5c + 1;
        printf(" %d",0);
        in_RSI = (htmlDocPtr)(ulong)uVar6;
        printf(" %d");
        putchar(10);
      }
    }
    bVar1 = false;
  }
  function_tests = function_tests + 1;
  iVar14 = 0;
  pxVar38 = (htmlDocPtr)0x0;
  while (iVar15 = (int)pxVar38, iVar15 != 3) {
    iVar16 = xmlMemBlocks();
    pxVar26 = gen_htmlParserCtxtPtr(iVar15,(int)in_RSI);
    htmlParseCharRef();
    call_tests = call_tests + 1;
    if (pxVar26 != (htmlParserCtxtPtr)0x0) {
      htmlFreeParserCtxt();
    }
    xmlResetLastError();
    iVar17 = xmlMemBlocks();
    if (iVar16 != iVar17) {
      iVar17 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlParseCharRef",(ulong)(uint)(iVar17 - iVar16));
      iVar14 = iVar14 + 1;
      printf(" %d");
      putchar(10);
      in_RSI = pxVar38;
    }
    pxVar38 = (htmlDocPtr)(ulong)(iVar15 + 1);
  }
  function_tests = function_tests + 1;
  local_58 = 0;
  for (iVar15 = 0; iVar15 != 3; iVar15 = iVar15 + 1) {
    for (uVar6 = 0; uVar6 != 4; uVar6 = uVar6 + 1) {
      uVar31 = 0;
      while (iVar16 = (int)uVar31, iVar16 != 4) {
        for (uVar41 = 0; uVar41 != 4; uVar41 = uVar41 + 1) {
          iVar17 = xmlMemBlocks();
          pxVar26 = gen_htmlParserCtxtPtr(iVar15,(int)in_RSI);
          if (uVar6 == 0) {
            bVar1 = false;
            pcVar34 = "foo";
          }
          else if (uVar6 == 2) {
            bVar1 = false;
            pcVar34 = "test/ent2";
          }
          else if (uVar6 == 1) {
            bVar1 = false;
            pcVar34 = "<foo/>";
          }
          else {
            bVar1 = true;
            pcVar34 = (char *)0x0;
          }
          iVar18 = gen_int(iVar16,(int)in_RSI);
          gen_int(uVar41,(int)in_RSI);
          if ((bVar1) || (sVar25 = strlen(pcVar34), iVar18 <= (int)sVar25 + 1)) {
            htmlParseChunk(pxVar26,pcVar34,iVar18);
            if (pxVar26 == (htmlParserCtxtPtr)0x0) {
              call_tests = call_tests + 1;
              in_RSI = (htmlDocPtr)pcVar34;
            }
            else {
              xmlFreeDoc(pxVar26->myDoc);
              pxVar26->myDoc = (xmlDocPtr)0x0;
              call_tests = call_tests + 1;
              htmlFreeParserCtxt();
              in_RSI = (htmlDocPtr)pcVar34;
            }
            xmlResetLastError();
            iVar18 = xmlMemBlocks();
            if (iVar17 != iVar18) {
              iVar18 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlParseChunk",(ulong)(uint)(iVar18 - iVar17));
              local_58 = local_58 + 1;
              printf(" %d",iVar15);
              printf(" %d",(ulong)uVar6);
              printf(" %d",uVar31);
              in_RSI = (htmlDocPtr)(ulong)uVar41;
              printf(" %d");
              putchar(10);
            }
          }
        }
        uVar31 = (ulong)(iVar16 + 1);
      }
    }
  }
  function_tests = function_tests + 1;
  iVar15 = 0;
  for (uVar6 = 0; uVar6 != 5; uVar6 = uVar6 + 1) {
    pxVar38 = (htmlDocPtr)0x0;
    puVar36 = &DAT_00167d78;
    while( true ) {
      iVar16 = (int)in_RSI;
      uVar41 = (uint)pxVar38;
      if (uVar41 == 4) break;
      iVar17 = xmlMemBlocks();
      pxVar29 = gen_const_xmlChar_ptr(uVar6,iVar16);
      if (uVar41 < 3) {
        in_RSI = (htmlDocPtr)*puVar36;
      }
      else {
        in_RSI = (htmlDocPtr)0x0;
      }
      pxVar28 = (htmlDocPtr)htmlParseDoc(pxVar29);
      desret_htmlDocPtr(pxVar28);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar16 = xmlMemBlocks();
      if (iVar17 != iVar16) {
        iVar16 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlParseDoc",(ulong)(uint)(iVar16 - iVar17));
        iVar15 = iVar15 + 1;
        printf(" %d",(ulong)uVar6);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar38;
      }
      pxVar38 = (htmlDocPtr)(ulong)(uVar41 + 1);
      puVar36 = puVar36 + 1;
    }
  }
  function_tests = function_tests + 1;
  iVar16 = 0;
  for (uVar6 = 0; uVar6 != 3; uVar6 = uVar6 + 1) {
    iVar17 = xmlMemBlocks();
    pxVar26 = gen_htmlParserCtxtPtr(uVar6,(int)in_RSI);
    htmlParseDocument();
    if (pxVar26 == (htmlParserCtxtPtr)0x0) {
      call_tests = call_tests + 1;
    }
    else {
      xmlFreeDoc(pxVar26->myDoc);
      pxVar26->myDoc = (xmlDocPtr)0x0;
      call_tests = call_tests + 1;
      htmlFreeParserCtxt();
    }
    xmlResetLastError();
    iVar18 = xmlMemBlocks();
    if (iVar17 != iVar18) {
      iVar18 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlParseDocument",(ulong)(uint)(iVar18 - iVar17));
      iVar16 = iVar16 + 1;
      in_RSI = (htmlDocPtr)(ulong)uVar6;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar17 = 0;
  for (uVar6 = 0; uVar6 != 3; uVar6 = uVar6 + 1) {
    iVar18 = xmlMemBlocks();
    pxVar26 = gen_htmlParserCtxtPtr(uVar6,(int)in_RSI);
    htmlParseElement();
    call_tests = call_tests + 1;
    if (pxVar26 != (htmlParserCtxtPtr)0x0) {
      htmlFreeParserCtxt();
    }
    xmlResetLastError();
    iVar19 = xmlMemBlocks();
    if (iVar18 != iVar19) {
      iVar19 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlParseElement",(ulong)(uint)(iVar19 - iVar18));
      iVar17 = iVar17 + 1;
      in_RSI = (htmlDocPtr)(ulong)uVar6;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar18 = 0;
  for (iVar19 = 0; iVar19 != 3; iVar19 = iVar19 + 1) {
    bVar1 = true;
    while (iVar21 = (int)in_RSI, bVar1) {
      iVar20 = xmlMemBlocks();
      pxVar26 = gen_htmlParserCtxtPtr(iVar19,iVar21);
      in_RSI = (htmlDocPtr)0x0;
      htmlParseEntityRef();
      call_tests = call_tests + 1;
      if (pxVar26 != (htmlParserCtxtPtr)0x0) {
        htmlFreeParserCtxt();
      }
      xmlResetLastError();
      iVar21 = xmlMemBlocks();
      if (iVar20 == iVar21) break;
      iVar21 = xmlMemBlocks();
      bVar1 = false;
      printf("Leak of %d blocks found in htmlParseEntityRef",(ulong)(uint)(iVar21 - iVar20));
      iVar18 = iVar18 + 1;
      printf(" %d");
      in_RSI = (htmlDocPtr)0x0;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar19 = 0;
LAB_0011cbbd:
  if (iVar19 == 8) {
    function_tests = function_tests + 1;
    local_48 = 0;
    for (uVar6 = 0; uVar6 != 5; uVar6 = uVar6 + 1) {
      for (uVar41 = 0; uVar41 != 8; uVar41 = uVar41 + 1) {
        uVar31 = 0;
        while (uVar43 = (uint)uVar31, uVar43 != 4) {
          pxVar38 = (htmlDocPtr)0x0;
          while( true ) {
            iVar21 = (int)in_RSI;
            iVar19 = (int)pxVar38;
            if (iVar19 == 4) break;
            iVar20 = xmlMemBlocks();
            pxVar29 = gen_const_xmlChar_ptr(uVar6,iVar21);
            in_RSI = (htmlDocPtr)gen_filepath(uVar41,iVar21);
            if (uVar43 < 3) {
              uVar30 = (&DAT_00167d78)[uVar31];
            }
            else {
              uVar30 = 0;
            }
            iVar21 = gen_int(iVar19,iVar21);
            pxVar28 = (htmlDocPtr)htmlReadDoc(pxVar29,in_RSI,uVar30,iVar21);
            desret_htmlDocPtr(pxVar28);
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar21 = xmlMemBlocks();
            if (iVar20 != iVar21) {
              iVar21 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlReadDoc",(ulong)(uint)(iVar21 - iVar20));
              local_48 = local_48 + 1;
              printf(" %d",(ulong)uVar6);
              printf(" %d",(ulong)uVar41);
              printf(" %d",uVar31);
              printf(" %d");
              putchar(10);
              in_RSI = pxVar38;
            }
            pxVar38 = (htmlDocPtr)(ulong)(iVar19 + 1);
          }
          uVar31 = (ulong)(uVar43 + 1);
        }
      }
    }
    function_tests = function_tests + 1;
    local_44 = 0;
    for (uVar6 = 0; uVar6 != 8; uVar6 = uVar6 + 1) {
      uVar31 = 0;
      while (uVar41 = (uint)uVar31, uVar41 != 4) {
        pxVar38 = (htmlDocPtr)0x0;
        while( true ) {
          iVar19 = (int)in_RSI;
          iVar21 = (int)pxVar38;
          if (iVar21 == 4) break;
          iVar20 = xmlMemBlocks();
          pcVar34 = gen_filepath(uVar6,iVar19);
          if (uVar41 < 3) {
            in_RSI = (htmlDocPtr)(&DAT_00167d78)[uVar31];
          }
          else {
            in_RSI = (htmlDocPtr)0x0;
          }
          iVar19 = gen_int(iVar21,iVar19);
          pxVar28 = (htmlDocPtr)htmlReadFile(pcVar34,in_RSI,iVar19);
          desret_htmlDocPtr(pxVar28);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar19 = xmlMemBlocks();
          if (iVar20 != iVar19) {
            iVar19 = xmlMemBlocks();
            printf("Leak of %d blocks found in htmlReadFile",(ulong)(uint)(iVar19 - iVar20));
            local_44 = local_44 + 1;
            printf(" %d",(ulong)uVar6);
            printf(" %d",uVar31);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar38;
          }
          pxVar38 = (htmlDocPtr)(ulong)(iVar21 + 1);
        }
        uVar31 = (ulong)(uVar41 + 1);
      }
    }
    function_tests = function_tests + 1;
    iVar19 = 0;
    for (uVar6 = 0; uVar6 != 4; uVar6 = uVar6 + 1) {
      for (uVar41 = 0; uVar41 != 4; uVar41 = uVar41 + 1) {
        for (iVar21 = 0; iVar21 != 8; iVar21 = iVar21 + 1) {
          uVar31 = 0;
          while (uVar43 = (uint)uVar31, uVar43 != 4) {
            for (uVar32 = 0; uVar32 != 4; uVar32 = uVar32 + 1) {
              iVar20 = xmlMemBlocks();
              if (uVar6 == 0) {
                bVar1 = false;
                pcVar34 = "foo";
              }
              else if (uVar6 == 2) {
                bVar1 = false;
                pcVar34 = "test/ent2";
              }
              else if (uVar6 == 1) {
                bVar1 = false;
                pcVar34 = "<foo/>";
              }
              else {
                bVar1 = true;
                pcVar34 = (char *)0x0;
              }
              uVar33 = gen_int(uVar41,(int)in_RSI);
              pcVar27 = gen_filepath(iVar21,(int)in_RSI);
              if (uVar43 < 3) {
                uVar30 = (&DAT_00167d78)[uVar31];
              }
              else {
                uVar30 = 0;
              }
              iVar22 = gen_int(uVar32,(int)in_RSI);
              if ((bVar1) || (sVar25 = strlen(pcVar34), (int)uVar33 <= (int)sVar25 + 1)) {
                in_RSI = (htmlDocPtr)(ulong)uVar33;
                pxVar38 = (htmlDocPtr)htmlReadMemory(pcVar34,in_RSI,pcVar27,uVar30,iVar22);
                desret_htmlDocPtr(pxVar38);
                call_tests = call_tests + 1;
                xmlResetLastError();
                iVar22 = xmlMemBlocks();
                if (iVar20 != iVar22) {
                  iVar22 = xmlMemBlocks();
                  printf("Leak of %d blocks found in htmlReadMemory",(ulong)(uint)(iVar22 - iVar20))
                  ;
                  iVar19 = iVar19 + 1;
                  printf(" %d",(ulong)uVar6);
                  printf(" %d",(ulong)uVar41);
                  printf(" %d",iVar21);
                  printf(" %d",uVar31);
                  in_RSI = (htmlDocPtr)(ulong)uVar32;
                  printf(" %d");
                  putchar(10);
                }
              }
            }
            uVar31 = (ulong)(uVar43 + 1);
          }
        }
      }
    }
    function_tests = function_tests + 1;
    iVar21 = 0;
    for (uVar6 = 0; uVar6 != 5; uVar6 = uVar6 + 1) {
      uVar31 = 0;
      while (uVar41 = (uint)uVar31, uVar41 != 4) {
        bVar1 = true;
        while (bVar1) {
          pxVar38 = (htmlDocPtr)0x0;
          while( true ) {
            iVar20 = (int)in_RSI;
            iVar22 = (int)pxVar38;
            if (iVar22 == 3) break;
            iVar23 = xmlMemBlocks();
            pxVar29 = gen_const_xmlChar_ptr(uVar6,iVar20);
            if (uVar41 < 3) {
              in_RSI = (htmlDocPtr)(&DAT_00167d78)[uVar31];
            }
            else {
              in_RSI = (htmlDocPtr)0x0;
            }
            piVar39 = &call_tests;
            if (iVar22 != 0) {
              if (iVar22 == 1) {
                piVar39 = (int *)0xffffffffffffffff;
              }
              else {
                piVar39 = (int *)0x0;
              }
            }
            pxVar28 = (htmlDocPtr)htmlSAXParseDoc(pxVar29,in_RSI,0,piVar39);
            desret_htmlDocPtr(pxVar28);
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar20 = xmlMemBlocks();
            if (iVar23 != iVar20) {
              iVar20 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlSAXParseDoc",(ulong)(uint)(iVar20 - iVar23));
              iVar21 = iVar21 + 1;
              printf(" %d",(ulong)uVar6);
              printf(" %d",uVar31);
              printf(" %d",0);
              printf(" %d");
              putchar(10);
              in_RSI = pxVar38;
            }
            pxVar38 = (htmlDocPtr)(ulong)(iVar22 + 1);
          }
          bVar1 = false;
        }
        uVar31 = (ulong)(uVar41 + 1);
      }
    }
    function_tests = function_tests + 1;
    iVar20 = 0;
    for (uVar6 = 0; uVar6 != 8; uVar6 = uVar6 + 1) {
      uVar31 = 0;
      while (uVar41 = (uint)uVar31, uVar41 != 4) {
        bVar1 = true;
        while (bVar1) {
          pxVar38 = (htmlDocPtr)0x0;
          while( true ) {
            iVar22 = (int)in_RSI;
            iVar23 = (int)pxVar38;
            if (iVar23 == 3) break;
            iVar24 = xmlMemBlocks();
            pcVar34 = gen_filepath(uVar6,iVar22);
            if (uVar41 < 3) {
              in_RSI = (htmlDocPtr)(&DAT_00167d78)[uVar31];
            }
            else {
              in_RSI = (htmlDocPtr)0x0;
            }
            piVar39 = &call_tests;
            if (iVar23 != 0) {
              if (iVar23 == 1) {
                piVar39 = (int *)0xffffffffffffffff;
              }
              else {
                piVar39 = (int *)0x0;
              }
            }
            pxVar28 = (htmlDocPtr)htmlSAXParseFile(pcVar34,in_RSI,0,piVar39);
            desret_htmlDocPtr(pxVar28);
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar22 = xmlMemBlocks();
            if (iVar24 != iVar22) {
              iVar22 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlSAXParseFile",(ulong)(uint)(iVar22 - iVar24));
              iVar20 = iVar20 + 1;
              printf(" %d",(ulong)uVar6);
              printf(" %d",uVar31);
              printf(" %d",0);
              printf(" %d");
              putchar(10);
              in_RSI = pxVar38;
            }
            pxVar38 = (htmlDocPtr)(ulong)(iVar23 + 1);
          }
          bVar1 = false;
        }
        uVar31 = (ulong)(uVar41 + 1);
      }
    }
    function_tests = function_tests + 1;
    uVar6 = iVar5 + iVar8 + iVar35 + iVar37 + iVar2 + iVar4 + iVar3 + iVar7 + iVar11 +
            iVar9 + iVar10 + (uint)(iVar13 != iVar12) + local_5c + iVar14 + local_58 + iVar15 +
            iVar16 + iVar17 + iVar18 + local_48 + local_44 + iVar19 + iVar21 + iVar20;
    if (uVar6 != 0) {
      printf("Module HTMLparser: %d errors\n",(ulong)uVar6);
    }
    return uVar6;
  }
  pcVar34 = gen_filepath(iVar19,(int)in_RSI);
  iVar21 = 0;
  do {
    pcVar27 = "foo";
    switch(iVar21) {
    case 0:
      break;
    case 1:
      pcVar27 = "<foo/>";
      break;
    case 2:
      pcVar27 = "test/ent2";
      break;
    default:
      pcVar27 = (char *)0x0;
      break;
    case 4:
      goto switchD_0011cbe2_caseD_4;
    }
    pxVar38 = (htmlDocPtr)htmlParseFile(pcVar34,pcVar27);
    desret_htmlDocPtr(pxVar38);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar21 = iVar21 + 1;
  } while( true );
switchD_0011cbe2_caseD_4:
  iVar19 = iVar19 + 1;
  in_RSI = (htmlDocPtr)0x1542e7;
  goto LAB_0011cbbd;
}

Assistant:

static int
test_HTMLparser(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing HTMLparser : 32 of 38 functions ...\n");
    test_ret += test_UTF8ToHtml();
    test_ret += test_htmlAttrAllowed();
    test_ret += test_htmlAutoCloseTag();
    test_ret += test_htmlCreateMemoryParserCtxt();
    test_ret += test_htmlCreatePushParserCtxt();
    test_ret += test_htmlCtxtReadDoc();
    test_ret += test_htmlCtxtReadFile();
    test_ret += test_htmlCtxtReadMemory();
    test_ret += test_htmlCtxtReset();
    test_ret += test_htmlCtxtUseOptions();
    test_ret += test_htmlElementAllowedHere();
    test_ret += test_htmlElementStatusHere();
    test_ret += test_htmlEncodeEntities();
    test_ret += test_htmlEntityLookup();
    test_ret += test_htmlEntityValueLookup();
    test_ret += test_htmlHandleOmittedElem();
    test_ret += test_htmlIsAutoClosed();
    test_ret += test_htmlIsScriptAttribute();
    test_ret += test_htmlNewParserCtxt();
    test_ret += test_htmlNodeStatus();
    test_ret += test_htmlParseCharRef();
    test_ret += test_htmlParseChunk();
    test_ret += test_htmlParseDoc();
    test_ret += test_htmlParseDocument();
    test_ret += test_htmlParseElement();
    test_ret += test_htmlParseEntityRef();
    test_ret += test_htmlParseFile();
    test_ret += test_htmlReadDoc();
    test_ret += test_htmlReadFile();
    test_ret += test_htmlReadMemory();
    test_ret += test_htmlSAXParseDoc();
    test_ret += test_htmlSAXParseFile();
    test_ret += test_htmlTagLookup();

    if (test_ret != 0)
	printf("Module HTMLparser: %d errors\n", test_ret);
    return(test_ret);
}